

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O1

FilteredBreakIteratorBuilder *
icu_63::FilteredBreakIteratorBuilder::createInstance(Locale *where,UErrorCode *status)

{
  SimpleFilteredBreakIteratorBuilder *this;
  SimpleFilteredBreakIteratorBuilder *pSVar1;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this = (SimpleFilteredBreakIteratorBuilder *)
           UMemory::operator_new((UMemory *)0x30,(size_t)status);
    if (this == (SimpleFilteredBreakIteratorBuilder *)0x0) {
      this = (SimpleFilteredBreakIteratorBuilder *)0x0;
    }
    else {
      SimpleFilteredBreakIteratorBuilder::SimpleFilteredBreakIteratorBuilder(this,where,status);
    }
    if ((this == (SimpleFilteredBreakIteratorBuilder *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR))
    {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    pSVar1 = (SimpleFilteredBreakIteratorBuilder *)0x0;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      pSVar1 = this;
    }
    if (this != (SimpleFilteredBreakIteratorBuilder *)0x0 && U_ZERO_ERROR < *status) {
      (*(this->super_FilteredBreakIteratorBuilder).super_UObject._vptr_UObject[1])(this);
    }
  }
  else {
    pSVar1 = (SimpleFilteredBreakIteratorBuilder *)0x0;
  }
  return &pSVar1->super_FilteredBreakIteratorBuilder;
}

Assistant:

FilteredBreakIteratorBuilder *
FilteredBreakIteratorBuilder::createInstance(const Locale& where, UErrorCode& status) {
  if(U_FAILURE(status)) return NULL;
  LocalPointer<FilteredBreakIteratorBuilder> ret(new SimpleFilteredBreakIteratorBuilder(where, status), status);
  return (U_SUCCESS(status))? ret.orphan(): NULL;
}